

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O2

void __thiscall
slang::ast::CaseAssertionExpr::visitExprs<no_old_always_syntax::MainVisitor&>
          (CaseAssertionExpr *this,AlwaysFFVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  pointer pIVar3;
  long lVar4;
  ItemGroup *item;
  pointer pIVar5;
  
  Expression::visit<no_old_always_syntax::MainVisitor&>(this->expr,visitor);
  pIVar5 = (this->items)._M_ptr;
  pIVar3 = pIVar5 + (this->items)._M_extent._M_extent_value;
  for (; pIVar5 != pIVar3; pIVar5 = pIVar5 + 1) {
    ppEVar1 = (pIVar5->expressions)._M_ptr;
    sVar2 = (pIVar5->expressions)._M_extent._M_extent_value;
    for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      Expression::visit<no_old_always_syntax::MainVisitor&>
                (*(Expression **)((long)ppEVar1 + lVar4),visitor);
    }
    AssertionExpr::visit<no_old_always_syntax::MainVisitor>((pIVar5->body).ptr,visitor);
  }
  if (this->defaultCase != (AssertionExpr *)0x0) {
    AssertionExpr::visit<no_old_always_syntax::MainVisitor>(this->defaultCase,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto e : item.expressions)
                e->visit(visitor);
            item.body->visit(visitor);
        }

        if (defaultCase)
            defaultCase->visit(visitor);
    }